

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void gl4cts::TextureViewUtilities::getMajorMinorVersionFromContextVersion
               (ContextType *context_type,GLint *out_major_version,GLint *out_minor_version)

{
  bool bVar1;
  ApiType other;
  TestError *this;
  ApiType local_4c;
  deUint32 local_48;
  ApiType local_44;
  deUint32 local_40;
  ApiType local_3c;
  deUint32 local_38;
  ApiType local_34;
  deUint32 local_30;
  ApiType local_2c;
  deUint32 local_28;
  ApiType local_24;
  GLint *local_20;
  GLint *out_minor_version_local;
  GLint *out_major_version_local;
  ContextType *context_type_local;
  
  local_20 = out_minor_version;
  out_minor_version_local = out_major_version;
  out_major_version_local = (GLint *)context_type;
  local_24 = glu::ContextType::getAPI(context_type);
  local_28 = (deUint32)glu::ApiType::core(4,0);
  bVar1 = glu::ApiType::operator==(&local_24,(ApiType)local_28);
  if (bVar1) {
    *out_minor_version_local = 4;
    *local_20 = 0;
  }
  else {
    local_2c = glu::ContextType::getAPI((ContextType *)out_major_version_local);
    local_30 = (deUint32)glu::ApiType::core(4,1);
    bVar1 = glu::ApiType::operator==(&local_2c,(ApiType)local_30);
    if (bVar1) {
      *out_minor_version_local = 4;
      *local_20 = 1;
    }
    else {
      local_34 = glu::ContextType::getAPI((ContextType *)out_major_version_local);
      local_38 = (deUint32)glu::ApiType::core(4,2);
      bVar1 = glu::ApiType::operator==(&local_34,(ApiType)local_38);
      if (bVar1) {
        *out_minor_version_local = 4;
        *local_20 = 2;
      }
      else {
        local_3c = glu::ContextType::getAPI((ContextType *)out_major_version_local);
        local_40 = (deUint32)glu::ApiType::core(4,3);
        bVar1 = glu::ApiType::operator==(&local_3c,(ApiType)local_40);
        if (bVar1) {
          *out_minor_version_local = 4;
          *local_20 = 3;
        }
        else {
          local_44 = glu::ContextType::getAPI((ContextType *)out_major_version_local);
          local_48 = (deUint32)glu::ApiType::core(4,4);
          bVar1 = glu::ApiType::operator==(&local_44,(ApiType)local_48);
          if (bVar1) {
            *out_minor_version_local = 4;
            *local_20 = 4;
          }
          else {
            local_4c = glu::ContextType::getAPI((ContextType *)out_major_version_local);
            other = glu::ApiType::core(4,5);
            bVar1 = glu::ApiType::operator==(&local_4c,other);
            if (!bVar1) {
              this = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this,"Unrecognized rendering context version",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                         ,0x680);
              __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
            *out_minor_version_local = 4;
            *local_20 = 5;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TextureViewUtilities::getMajorMinorVersionFromContextVersion(const glu::ContextType& context_type,
																  glw::GLint*			  out_major_version,
																  glw::GLint*			  out_minor_version)
{
	if (context_type.getAPI() == glu::ApiType::core(4, 0))
	{
		*out_major_version = 4;
		*out_minor_version = 0;
	}
	else if (context_type.getAPI() == glu::ApiType::core(4, 1))
	{
		*out_major_version = 4;
		*out_minor_version = 1;
	}
	else if (context_type.getAPI() == glu::ApiType::core(4, 2))
	{
		*out_major_version = 4;
		*out_minor_version = 2;
	}
	else if (context_type.getAPI() == glu::ApiType::core(4, 3))
	{
		*out_major_version = 4;
		*out_minor_version = 3;
	}
	else if (context_type.getAPI() == glu::ApiType::core(4, 4))
	{
		*out_major_version = 4;
		*out_minor_version = 4;
	}
	else if (context_type.getAPI() == glu::ApiType::core(4, 5))
	{
		*out_major_version = 4;
		*out_minor_version = 5;
	}
	else
	{
		TCU_FAIL("Unrecognized rendering context version");
	}
}